

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void notify_service_state(char *name,char *state)

{
  size_t sVar1;
  char pname [92];
  char acStack_78 [96];
  
  sVar1 = strlen(name);
  if ((int)sVar1 < 0x53) {
    snprintf(acStack_78,0x5c,"init.svc.%s",name);
    property_set(acStack_78,state);
  }
  return;
}

Assistant:

static void notify_service_state(const char *name, const char *state)
{
    char pname[PROP_NAME_MAX];
    int len = strlen(name);
    if ((len + 10) > PROP_NAME_MAX)
        return;
    snprintf(pname, sizeof(pname), "init.svc.%s", name);
    property_set(pname, state);
}